

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

void __thiscall
QDockWidgetGroupWindow::paintEvent(QDockWidgetGroupWindow *this,QPaintEvent *param_1)

{
  bool bVar1;
  QLayout *pQVar2;
  long in_FS_OFFSET;
  QStyleOptionFrame framOpt;
  undefined1 *local_98;
  QDockWidgetGroupWindow *pQStack_90;
  QStyle *local_88;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QWidget::layout((QWidget *)this);
  bVar1 = hasNativeDecos(*(QDockWidgetGroupWindow **)(*(long *)&pQVar2->field_0x8 + 0x10));
  if (!bVar1) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)&local_78);
    QStyleOption::initFrom((QStyleOption *)&local_78,(QWidget *)this);
    local_88 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_90 = (QDockWidgetGroupWindow *)&DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter((QPainter *)&local_98);
    pQStack_90 = this;
    local_88 = QWidget::style((QWidget *)this);
    QPainter::begin((QPaintDevice *)&local_98);
    QPainter::setRenderHint((RenderHint)&local_98,true);
    (**(code **)(*(long *)local_88 + 0xb0))
              (local_88,2,(QStyleOptionFrame *)&local_78,&local_98,pQStack_90);
    QPainter::~QPainter((QPainter *)&local_98);
    QStyleOption::~QStyleOption((QStyleOption *)&local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockWidgetGroupWindow::paintEvent(QPaintEvent *)
{
    QDockWidgetGroupLayout *lay = static_cast<QDockWidgetGroupLayout *>(layout());
    bool nativeDeco = lay->nativeWindowDeco();

    if (!nativeDeco) {
        QStyleOptionFrame framOpt;
        framOpt.initFrom(this);
        QStylePainter p(this);
        p.drawPrimitive(QStyle::PE_FrameDockWidget, framOpt);
    }
}